

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

int mixed_buffer_to_pack(mixed_buffer **ins,mixed_pack *out,float *volume,float target_volume)

{
  float encoding;
  mixed_buffer *pmVar1;
  float *pfVar2;
  long lVar3;
  mixed_transfer_function_to p_Var4;
  void *pvVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  byte bVar8;
  uint32_t uVar9;
  float **area;
  undefined8 uStack_80;
  undefined1 auStack_78 [4];
  uint local_74;
  undefined1 *local_70;
  uint local_68;
  char local_61;
  uint32_t i_1;
  int8_t c;
  float vol;
  uint8_t size;
  mixed_transfer_function_to fun;
  ulong uStack_48;
  uint32_t i;
  unsigned_long __vla_expr0;
  void *local_38;
  char *outd;
  uint32_t frames;
  uint32_t frames_to_bytes;
  mixed_channel_t channels;
  float *pfStack_20;
  float target_volume_local;
  float *volume_local;
  mixed_pack *out_local;
  mixed_buffer **ins_local;
  
  frames._3_1_ = out->channels;
  local_74 = (uint)frames._3_1_;
  uStack_80 = 0x1cc846;
  frames_to_bytes = (uint32_t)target_volume;
  pfStack_20 = volume;
  volume_local = (float *)out;
  out_local = (mixed_pack *)ins;
  bVar8 = mixed_samplesize(out->encoding);
  pfVar2 = volume_local;
  outd._4_4_ = local_74 * bVar8;
  outd._0_4_ = 0xffffffff;
  uStack_48 = (ulong)frames._3_1_;
  lVar3 = -(ulong)((uint)frames._3_1_ * 8 + 0xf & 0xfffffff0);
  local_70 = auStack_78 + lVar3;
  __vla_expr0 = (unsigned_long)auStack_78;
  *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x1cc898;
  mixed_pack_request_write(&local_38,(uint32_t *)&outd,(mixed_pack *)pfVar2);
  outd._0_4_ = (uint)outd / outd._4_4_;
  for (fun._4_4_ = 0; fun._4_4_ < frames._3_1_; fun._4_4_ = fun._4_4_ + 1) {
    area = (float **)(local_70 + (ulong)fun._4_4_ * 8);
    pmVar1 = (mixed_buffer *)(&out_local->_data)[fun._4_4_];
    *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x1cc8d7;
    mixed_buffer_request_read(area,(uint32_t *)&outd,pmVar1);
  }
  if ((uint)outd != 0) {
    _vol = transfer_array_functions_to[(int)volume_local[6] - 1];
    encoding = volume_local[6];
    *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x1cc916;
    c = mixed_samplesize((mixed_encoding)encoding);
    i_1 = (uint32_t)*pfStack_20;
    *pfStack_20 = (float)frames_to_bytes;
    for (local_61 = '\0'; uVar7 = frames_to_bytes, bVar8 = frames._3_1_, uVar6 = (uint)outd,
        pvVar5 = local_38, p_Var4 = _vol, uVar9 = i_1, (int)local_61 < (int)(uint)frames._3_1_;
        local_61 = local_61 + '\x01') {
      pfVar2 = *(float **)(local_70 + (long)local_61 * 8);
      *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x1cc96d;
      (*p_Var4)(pfVar2,pvVar5,bVar8,uVar6,(float)uVar9,(float)uVar7);
      local_38 = (void *)((long)local_38 + (long)(int)(uint)(byte)c);
    }
  }
  pfVar2 = volume_local;
  uVar9 = (uint)outd * outd._4_4_;
  *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x1cc99b;
  mixed_pack_finish_write(uVar9,(mixed_pack *)pfVar2);
  for (local_68 = 0; uVar9 = (uint)outd, local_68 < frames._3_1_; local_68 = local_68 + 1) {
    pmVar1 = (mixed_buffer *)(&out_local->_data)[local_68];
    *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x1cc9c0;
    mixed_buffer_finish_read(uVar9,pmVar1);
  }
  return 1;
}

Assistant:

int mixed_buffer_to_pack(struct mixed_buffer **ins, struct mixed_pack *out, float *volume, float target_volume){
  mixed_channel_t channels = out->channels;
  uint32_t frames_to_bytes = channels * mixed_samplesize(out->encoding);
  uint32_t frames = UINT32_MAX;
  char *outd;
  float *ind[channels];

  mixed_pack_request_write((void**)&outd, &frames, out);
  frames = frames / frames_to_bytes;
  for(uint32_t i=0; i<channels; ++i)
    mixed_buffer_request_read(&ind[i], &frames, ins[i]);

  if(0 < frames){
    mixed_transfer_function_to fun = transfer_array_functions_to[out->encoding-1];
    uint8_t size = mixed_samplesize(out->encoding);
    float vol = *volume;
    // KLUDGE: this is not necessarily correct...
    *volume = target_volume;
    for(int8_t c=0; c<channels; ++c){
      fun(ind[c], outd, channels, frames, vol, target_volume);
      outd += size;
    }
  }

  mixed_pack_finish_write(frames * frames_to_bytes, out);
  for(uint32_t i=0; i<channels; ++i)
    mixed_buffer_finish_read(frames, ins[i]);
  
  return 1;
}